

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long *plVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  parasail_result_t *ppVar22;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  long lVar23;
  long lVar24;
  __m128i *palVar25;
  size_t len;
  size_t len_00;
  ulong uVar26;
  uint uVar27;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  long lVar28;
  uint uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  int64_t tmp;
  long lVar33;
  long lVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  ulong size;
  ulong uVar38;
  ulong uVar39;
  undefined1 auVar40 [12];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar53;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [12];
  __m128i_64_t B_3;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long lVar64;
  undefined1 auVar65 [12];
  long lVar67;
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  __m128i_64_t A;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  __m128i_64_t A_1;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i_64_t B;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  long lVar88;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i_64_t B_7;
  int64_t iVar92;
  long lVar93;
  __m128i_64_t B_8;
  __m128i_64_t B_1;
  undefined1 auVar94 [16];
  __m128i alVar95;
  __m128i alVar96;
  __m128i alVar97;
  __m128i alVar98;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  long local_150;
  long local_148;
  undefined1 local_138 [16];
  long lStack_120;
  undefined1 local_118 [16];
  long local_108;
  long lStack_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  ulong uStack_d0;
  longlong extraout_RDX_00;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_stats_table_scan_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar2 = (profile->profile64).score;
    if (pvVar2 == (void *)0x0) {
      parasail_nw_stats_table_scan_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_nw_stats_table_scan_profile_sse41_128_64_cold_6();
      }
      else {
        uVar27 = profile->s1Len;
        if ((int)uVar27 < 1) {
          parasail_nw_stats_table_scan_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_stats_table_scan_profile_sse41_128_64_cold_4();
        }
        else {
          uVar36 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_stats_table_scan_profile_sse41_128_64_cold_1();
          }
          else {
            local_1d8._0_4_ = gap;
            uVar29 = uVar27 - 1;
            size = (ulong)uVar27 + 1 >> 1;
            uVar6 = (ulong)uVar29 % size;
            iVar18 = (int)(uVar29 / size);
            pvVar4 = (profile->profile64).matches;
            pvVar5 = (profile->profile64).similar;
            iVar35 = -open;
            iVar20 = ppVar3->min;
            uVar37 = 0x8000000000000000 - (long)iVar20;
            if (iVar20 != iVar35 && SBORROW4(iVar20,iVar35) == iVar20 + open < 0) {
              uVar37 = (ulong)(uint)open | 0x8000000000000000;
            }
            iVar20 = ppVar3->max;
            ppVar22 = parasail_result_new_table3((uint)((ulong)uVar27 + 1) & 0x7ffffffe,s2Len);
            if (ppVar22 != (parasail_result_t *)0x0) {
              local_1c8._0_4_ = iVar35;
              ppVar22->flag = ppVar22->flag | 0x2830401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1U));
              alVar95[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              alVar95[1]._0_1_ = ptr_00 == (__m128i *)0x0;
              auVar41._0_8_ = -(ulong)(b == (__m128i *)0x0);
              auVar41._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
              auVar82._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
              auVar82._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
              auVar41 = packssdw(auVar41,auVar82);
              auVar55._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
              auVar55._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
              auVar58._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
              auVar58._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
              auVar55 = packssdw(auVar55,auVar58);
              auVar41 = packssdw(auVar41,auVar55);
              if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                    ptr_05 != (__m128i *)0x0) &&
                   ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                   ptr_02 != (__m128i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                  ((((((((((((((((auVar41 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                                (auVar41 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar41 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar41 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar41 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar41 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar41 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar41 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar41 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar41 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar41 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar41 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar41 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar41[0xf])) {
                iVar19 = s2Len + -1;
                uVar38 = (ulong)(uint)gap;
                lVar23 = uVar37 + 1;
                len = 0x7ffffffffffffffe - (long)iVar20;
                auVar42._8_4_ = (int)lVar23;
                auVar42._0_8_ = lVar23;
                auVar42._12_4_ = (int)((ulong)lVar23 >> 0x20);
                uVar53 = (undefined4)(len >> 0x20);
                local_118._8_4_ = (int)len;
                local_118._0_8_ = len;
                local_118._12_4_ = uVar53;
                alVar95[0] = size;
                len_00 = len;
                parasail_memset___m128i(b_03,alVar95,len);
                alVar96[1] = extraout_RDX_00;
                alVar96[0] = size;
                parasail_memset___m128i(b_04,alVar96,len_00);
                alVar97[1] = extraout_RDX_01;
                alVar97[0] = size;
                parasail_memset___m128i(b_05,alVar97,len_00);
                alVar98[1] = extraout_RDX_02;
                alVar98[0] = size;
                parasail_memset___m128i(b,alVar98,len_00);
                c[1] = extraout_RDX_03;
                c[0] = size;
                parasail_memset___m128i(b_00,c,len_00);
                c_00[1] = extraout_RDX_04;
                c_00[0] = size;
                parasail_memset___m128i(b_01,c_00,len_00);
                c_01[1] = extraout_RDX_05;
                c_01[0] = size;
                parasail_memset___m128i(b_02,c_01,len_00);
                uStack_d0 = (ulong)(uint)gap;
                auVar70._8_4_ = open;
                auVar70._0_8_ = CONCAT44(0,open);
                auVar70._12_4_ = 0;
                lVar64 = -CONCAT44(0,open);
                lVar67 = -(ulong)(uint)open;
                uVar26 = (ulong)((int)size - 1);
                lVar24 = uVar26 << 4;
                auVar43 = pmovsxbq(auVar70,0x101);
                auVar71._8_4_ = 0xffffffff;
                auVar71._0_8_ = 0xffffffffffffffff;
                auVar71._12_4_ = 0xffffffff;
                uVar30 = size;
                do {
                  plVar1 = (long *)((long)*ptr_04 + lVar24);
                  *plVar1 = lVar64;
                  plVar1[1] = lVar67;
                  *(undefined1 (*) [16])((long)*ptr_05 + lVar24) = auVar43;
                  lVar64 = lVar64 - uVar38;
                  lVar67 = lVar67 - uStack_d0;
                  lVar33 = auVar43._8_8_;
                  auVar43._0_8_ = auVar43._0_8_ + 1;
                  auVar43._8_8_ = lVar33 - auVar71._8_8_;
                  lVar24 = lVar24 + -0x10;
                  iVar20 = (int)uVar30;
                  uVar27 = iVar20 - 1;
                  uVar30 = (ulong)uVar27;
                } while (uVar27 != 0 && 0 < iVar20);
                uVar30 = (ulong)(uint)gap;
                lVar67 = (long)iVar35;
                lVar33 = size << 4;
                lVar24 = 0;
                lVar64 = lVar67;
                do {
                  auVar74._8_8_ = lVar64 - size * uVar30;
                  auVar74._0_8_ = lVar64;
                  *(undefined1 (*) [16])((long)*ptr + lVar24) = auVar74;
                  lVar64 = lVar64 - uVar30;
                  lVar24 = lVar24 + 0x10;
                } while (lVar33 != lVar24);
                *ptr_06 = 0;
                uVar31 = 0;
                auVar41 = pmovsxbq(auVar74,0x100);
                uVar17 = (ulong)DAT_00906ca0;
                uVar39 = uVar36 - 1 ^ uVar17;
                do {
                  if ((bool)(~((long)uVar39 < (long)(uVar31 ^ uVar17)) & 1)) {
                    ptr_06[uVar31 + 1] = lVar67;
                  }
                  if ((long)((uVar31 | auVar41._0_8_) ^ uVar17) <= (long)uVar39) {
                    ptr_06[uVar31 + 2] = lVar67 - uVar30;
                  }
                  uVar31 = uVar31 + 2;
                  lVar67 = lVar67 + uVar30 * -2;
                } while ((s2Len + 1U & 0xfffffffe) != uVar31);
                palVar25 = ptr + uVar26;
                local_148 = size * uVar36 * 4;
                local_150 = 0;
                uVar30 = 0;
                lStack_120 = auVar42._8_8_;
                local_138._8_8_ = lStack_120;
                local_138._0_8_ = lVar23;
                do {
                  lStack_e0 = b_03[uVar26][0];
                  lStack_f0 = b_04[uVar26][0];
                  lStack_100 = b_05[uVar26][0];
                  auVar85._8_4_ = (int)(*palVar25)[0];
                  auVar85._0_8_ = (*palVar25)[0];
                  auVar85._12_4_ = *(undefined4 *)((long)*palVar25 + 4);
                  local_e8 = 0;
                  local_f8 = 0;
                  local_108 = 0;
                  lVar34 = (long)ppVar3->mapper[(byte)s2[uVar30]] * (long)(int)size * 0x10;
                  lVar64 = lVar23 - (*ptr_04)[0];
                  lVar67 = lStack_120 - (*ptr_04)[1];
                  local_1a8 = (undefined1  [16])0x0;
                  lVar32 = 0;
                  auVar55 = ZEXT816(0);
                  local_1b8 = (undefined1  [16])0x0;
                  auVar41 = auVar42;
                  iVar92 = ptr_06[uVar30];
                  lVar24 = auVar85._8_8_;
                  do {
                    plVar1 = (long *)((long)*ptr + lVar32);
                    lVar14 = *plVar1;
                    lVar15 = plVar1[1];
                    auVar82 = *(undefined1 (*) [16])((long)*b_03 + lVar32);
                    auVar58 = *(undefined1 (*) [16])((long)*b_04 + lVar32);
                    plVar1 = (long *)((long)*b + lVar32);
                    auVar66._0_8_ = lVar14 - auVar70._0_8_;
                    auVar66._8_8_ = lVar15 - auVar70._8_8_;
                    auVar84._0_8_ = *plVar1 - uVar38;
                    auVar84._8_8_ = plVar1[1] - uStack_d0;
                    auVar60._0_8_ = -(ulong)(auVar84._0_8_ < auVar66._0_8_);
                    auVar60._8_8_ = -(ulong)(auVar84._8_8_ < auVar66._8_8_);
                    auVar70 = blendvpd(*(undefined1 (*) [16])((long)*b_00 + lVar32),auVar82,auVar60)
                    ;
                    auVar71 = blendvpd(*(undefined1 (*) [16])((long)*b_01 + lVar32),auVar58,auVar60)
                    ;
                    auVar43 = *(undefined1 (*) [16])((long)*b_05 + lVar32);
                    auVar74 = blendvpd(*(undefined1 (*) [16])((long)*b_02 + lVar32),auVar43,auVar60)
                    ;
                    plVar1 = (long *)((long)*ptr_04 + lVar32);
                    auVar94._0_8_ = lVar64 + *plVar1;
                    auVar94._8_8_ = lVar67 + plVar1[1];
                    auVar44._0_8_ = -(ulong)(auVar41._0_8_ < auVar94._0_8_);
                    auVar44._8_8_ = -(ulong)(auVar41._8_8_ < auVar94._8_8_);
                    auVar41 = blendvpd(auVar41,auVar94,auVar44);
                    local_1b8 = blendvpd(local_1b8,local_1c8,auVar44);
                    auVar55 = blendvpd(auVar55,local_1d8,auVar44);
                    plVar1 = (long *)((long)*ptr_05 + lVar32);
                    auVar77._0_8_ = in_XMM7._0_8_ + *plVar1;
                    auVar77._8_8_ = in_XMM7._8_8_ + plVar1[1];
                    local_1a8 = blendvpd(local_1a8,auVar77,auVar44);
                    plVar1 = (long *)((long)pvVar2 + lVar32 + lVar34);
                    lVar93 = iVar92 + *plVar1;
                    lVar24 = lVar24 + plVar1[1];
                    auVar85 = blendvpd(auVar84,auVar66,auVar60);
                    lVar28 = auVar85._0_8_;
                    lVar64 = lVar93;
                    if (lVar93 < lVar28) {
                      lVar64 = lVar28;
                    }
                    lVar88 = auVar85._8_8_;
                    lVar67 = lVar24;
                    if (lVar24 < lVar88) {
                      lVar67 = lVar88;
                    }
                    plVar1 = (long *)((long)pvVar4 + lVar32 + lVar34);
                    auVar89._0_8_ = local_e8 + *plVar1;
                    auVar89._8_8_ = lStack_e0 + plVar1[1];
                    plVar1 = (long *)((long)pvVar5 + lVar32 + lVar34);
                    auVar80._0_8_ = local_f8 + *plVar1;
                    auVar80._8_8_ = lStack_f0 + plVar1[1];
                    *(undefined1 (*) [16])((long)*b + lVar32) = auVar85;
                    auVar45._0_8_ = -(ulong)(lVar93 < lVar28);
                    auVar45._8_8_ = -(ulong)(lVar24 < lVar88);
                    local_1c8 = blendvpd(auVar89,auVar70,auVar45);
                    local_1d8 = blendvpd(auVar80,auVar71,auVar45);
                    auVar61._8_4_ = 0xffffffff;
                    auVar61._0_8_ = 0xffffffffffffffff;
                    auVar61._12_4_ = 0xffffffff;
                    auVar75._0_8_ = auVar74._0_8_ + 1;
                    auVar75._8_8_ = auVar74._8_8_ - auVar61._8_8_;
                    auVar78._0_8_ = local_108 + 1;
                    auVar78._8_8_ = lStack_100 - auVar61._8_8_;
                    in_XMM7 = blendvpd(auVar78,auVar75,auVar45);
                    *(undefined1 (*) [16])((long)*b_00 + lVar32) = auVar70;
                    *(undefined1 (*) [16])((long)*b_01 + lVar32) = auVar71;
                    *(undefined1 (*) [16])((long)*b_02 + lVar32) = auVar75;
                    auVar70._0_8_ = CONCAT44(0,open);
                    auVar70._12_4_ = 0;
                    plVar1 = (long *)((long)*ptr + lVar32);
                    *plVar1 = lVar93;
                    plVar1[1] = lVar24;
                    *(undefined1 (*) [16])((long)*b_03 + lVar32) = auVar89;
                    *(undefined1 (*) [16])((long)*b_04 + lVar32) = auVar80;
                    *(undefined1 (*) [16])((long)*b_05 + lVar32) = auVar78;
                    lVar32 = lVar32 + 0x10;
                    local_108 = auVar43._0_8_;
                    lStack_100 = auVar43._8_8_;
                    local_f8 = auVar58._0_8_;
                    lStack_f0 = auVar58._8_8_;
                    local_e8 = auVar82._0_8_;
                    lStack_e0 = auVar82._8_8_;
                    iVar92 = lVar14;
                    lVar24 = lVar15;
                  } while (lVar33 != lVar32);
                  lVar67 = ptr_06[uVar30 + 1];
                  auVar7._8_8_ = 0;
                  auVar7._0_8_ = local_1c8._0_8_;
                  local_1c8 = auVar7 << 0x40;
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = local_1d8._0_8_;
                  local_1d8 = auVar8 << 0x40;
                  uVar30 = uVar30 + 1;
                  lVar24 = (*ptr_04)[0] + lVar67;
                  lVar32 = auVar41._0_8_;
                  auVar56._0_8_ = -(ulong)(lVar24 < lVar32);
                  auVar56._8_8_ = -(ulong)((*ptr_04)[1] + lVar64 < auVar41._8_8_);
                  if (lVar24 < lVar32) {
                    lVar24 = lVar32;
                  }
                  auVar41 = blendvpd(local_1c8,local_1b8,auVar56);
                  auVar55 = blendvpd(local_1d8,auVar55,auVar56);
                  auVar82 = blendvpd((undefined1  [16])*ptr_05,local_1a8,auVar56);
                  auVar9._8_8_ = 0;
                  auVar9._0_8_ = in_XMM7._0_8_;
                  in_XMM7 = auVar9 << 0x40;
                  auVar79._8_8_ = 0;
                  auVar79._0_8_ = auVar41._0_8_;
                  auVar79 = auVar79 << 0x40;
                  auVar81._8_8_ = 0;
                  auVar81._0_8_ = auVar55._0_8_;
                  auVar81 = auVar81 << 0x40;
                  auVar10._8_8_ = 0;
                  auVar10._0_8_ = auVar82._0_8_;
                  auVar83 = auVar10 << 0x40;
                  auVar87._8_8_ = lVar24;
                  auVar87._0_8_ = lVar23;
                  lVar32 = lVar67;
                  if (lVar67 < lVar23) {
                    lVar32 = lVar23;
                  }
                  auVar46._0_8_ = -(ulong)(lVar67 < lVar23);
                  auVar46._8_8_ = -(ulong)(lVar64 < lVar24);
                  if (lVar64 < lVar24) {
                    lVar64 = lVar24;
                  }
                  auVar41 = blendvpd(local_1c8,auVar79,auVar46);
                  auVar55 = blendvpd(local_1d8,auVar81,auVar46);
                  auVar82 = blendvpd(in_XMM7,auVar83,auVar46);
                  auVar91._8_8_ = lVar64;
                  auVar91._0_8_ = lVar32;
                  lVar24 = 0;
                  lVar64 = local_148;
                  lVar67 = local_150;
                  do {
                    auVar90._0_8_ = auVar91._0_8_ - CONCAT44(0,open);
                    auVar90._8_8_ = auVar91._8_8_ - (ulong)(uint)open;
                    auVar86._0_8_ = auVar87._0_8_ - uVar38;
                    auVar86._8_8_ = auVar87._8_8_ - uStack_d0;
                    auVar47._0_8_ = -(ulong)(auVar86._0_8_ < auVar90._0_8_);
                    auVar47._8_8_ = -(ulong)(auVar86._8_8_ < auVar90._8_8_);
                    auVar79 = blendvpd(auVar79,auVar41,auVar47);
                    auVar41 = *(undefined1 (*) [16])((long)*ptr + lVar24);
                    auVar81 = blendvpd(auVar81,auVar55,auVar47);
                    auVar55 = *(undefined1 (*) [16])((long)*b + lVar24);
                    auVar82 = blendvpd(auVar83,auVar82,auVar47);
                    auVar87 = blendvpd(auVar86,auVar90,auVar47);
                    auVar62._0_8_ = -(ulong)(auVar55._0_8_ < auVar41._0_8_);
                    auVar62._8_8_ = -(ulong)(auVar55._8_8_ < auVar41._8_8_);
                    auVar55 = blendvpd(auVar55,auVar41,auVar62);
                    auVar63._0_8_ = -(ulong)(auVar87._0_8_ < auVar55._0_8_);
                    auVar63._8_8_ = -(ulong)(auVar87._8_8_ < auVar55._8_8_);
                    auVar91 = blendvpd(auVar87,auVar55,auVar63);
                    auVar55 = blendvpd(auVar79,*(undefined1 (*) [16])((long)*b_00 + lVar24),auVar63)
                    ;
                    lVar32 = auVar91._0_8_;
                    auVar57._0_8_ = -(ulong)(auVar41._0_8_ == lVar32);
                    lVar34 = auVar91._8_8_;
                    auVar57._8_8_ = -(ulong)(auVar41._8_8_ == lVar34);
                    auVar41 = blendvpd(auVar55,*(undefined1 (*) [16])((long)*b_03 + lVar24),auVar57)
                    ;
                    auVar83._0_8_ = auVar82._0_8_ + 1;
                    auVar83._8_8_ = auVar82._8_8_ + 1;
                    auVar55 = blendvpd(auVar81,*(undefined1 (*) [16])((long)*b_01 + lVar24),auVar63)
                    ;
                    auVar55 = blendvpd(auVar55,*(undefined1 (*) [16])((long)*b_04 + lVar24),auVar57)
                    ;
                    auVar82 = blendvpd(auVar83,*(undefined1 (*) [16])((long)*b_02 + lVar24),auVar63)
                    ;
                    auVar82 = blendvpd(auVar82,*(undefined1 (*) [16])((long)*b_05 + lVar24),auVar57)
                    ;
                    auVar48._0_8_ = -(ulong)(local_118._0_8_ < lVar32);
                    auVar48._8_8_ = -(ulong)(local_118._8_8_ < lVar34);
                    local_118 = blendvpd(auVar91,local_118,auVar48);
                    auVar49._0_8_ = -(ulong)(lVar32 < local_138._0_8_);
                    auVar49._8_8_ = -(ulong)(lVar34 < local_138._8_8_);
                    auVar58 = blendvpd(auVar91,local_138,auVar49);
                    auVar50._0_8_ = -(ulong)(auVar41._0_8_ < auVar58._0_8_);
                    auVar50._8_8_ = -(ulong)(auVar41._8_8_ < auVar58._8_8_);
                    auVar58 = blendvpd(auVar41,auVar58,auVar50);
                    auVar51._0_8_ = -(ulong)(auVar55._0_8_ < auVar58._0_8_);
                    auVar51._8_8_ = -(ulong)(auVar55._8_8_ < auVar58._8_8_);
                    auVar58 = blendvpd(auVar55,auVar58,auVar51);
                    auVar52._0_8_ = -(ulong)(auVar82._0_8_ < auVar58._0_8_);
                    auVar52._8_8_ = -(ulong)(auVar82._8_8_ < auVar58._8_8_);
                    local_138 = blendvpd(auVar82,auVar58,auVar52);
                    *(undefined1 (*) [16])((long)*ptr + lVar24) = auVar91;
                    *(undefined1 (*) [16])((long)*b_03 + lVar24) = auVar41;
                    *(undefined1 (*) [16])((long)*b_04 + lVar24) = auVar55;
                    *(undefined1 (*) [16])((long)*b_05 + lVar24) = auVar82;
                    lVar32 = *((ppVar22->field_4).trace)->trace_del_table;
                    *(int *)(lVar32 + lVar67) = auVar91._0_4_;
                    *(int *)(lVar32 + lVar64) = auVar91._8_4_;
                    lVar32 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar32 + lVar67) = auVar41._0_4_;
                    *(int *)(lVar32 + lVar64) = auVar41._8_4_;
                    lVar32 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar32 + lVar67) = auVar55._0_4_;
                    *(int *)(lVar32 + lVar64) = auVar55._8_4_;
                    lVar32 = *(long *)((long)((ppVar22->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar32 + lVar67) = auVar82._0_4_;
                    *(int *)(lVar32 + lVar64) = auVar82._8_4_;
                    lVar24 = lVar24 + 0x10;
                    lVar64 = lVar64 + uVar36 * 4;
                    lVar67 = lVar67 + uVar36 * 4;
                  } while (lVar33 != lVar24);
                  local_148 = local_148 + 4;
                  local_150 = local_150 + 4;
                } while (uVar30 != uVar36);
                alVar95 = ptr[uVar6];
                auVar65 = alVar95._0_12_;
                alVar96 = b_03[uVar6];
                auVar59 = alVar96._0_12_;
                alVar97 = b_04[uVar6];
                auVar54 = alVar97._0_12_;
                alVar98 = b_05[uVar6];
                auVar40 = alVar98._0_12_;
                if (iVar18 < 1) {
                  do {
                    auVar11._8_8_ = 0;
                    auVar11._0_8_ = alVar95[0];
                    alVar95 = (__m128i)(auVar11 << 0x40);
                    auVar65 = alVar95._0_12_;
                    auVar12._8_8_ = 0;
                    auVar12._0_8_ = alVar96[0];
                    alVar96 = (__m128i)(auVar12 << 0x40);
                    auVar59 = alVar96._0_12_;
                    auVar13._8_8_ = 0;
                    auVar13._0_8_ = alVar97[0];
                    alVar97 = (__m128i)(auVar13 << 0x40);
                    auVar54 = alVar97._0_12_;
                    auVar16._8_8_ = 0;
                    auVar16._0_8_ = alVar98[0];
                    alVar98 = (__m128i)(auVar16 << 0x40);
                    auVar40 = alVar98._0_12_;
                  } while (iVar18 < 0);
                }
                auVar68._8_4_ = (int)uVar37;
                auVar68._0_8_ = uVar37;
                auVar68._12_4_ = (int)(uVar37 >> 0x20);
                auVar72._0_8_ = -(ulong)((long)uVar37 < (long)local_118._0_8_);
                auVar72._8_8_ = -(ulong)(auVar68._8_8_ < (long)local_118._8_8_);
                auVar69._8_4_ = 0xffffffff;
                auVar69._0_8_ = 0xffffffffffffffff;
                auVar69._12_4_ = 0xffffffff;
                auVar73._8_4_ = (int)len;
                auVar73._0_8_ = len;
                auVar73._12_4_ = uVar53;
                auVar76._0_8_ = -(ulong)((long)len < (long)local_138._0_8_);
                auVar76._8_8_ = -(ulong)(auVar73._8_8_ < (long)local_138._8_8_);
                iVar20 = movmskpd(iVar18,auVar76 | auVar69 ^ auVar72);
                if (iVar20 == 0) {
                  iVar20 = auVar65._8_4_;
                  iVar18 = auVar59._8_4_;
                  iVar35 = auVar54._8_4_;
                  iVar21 = auVar40._8_4_;
                }
                else {
                  *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
                  iVar20 = 0;
                  iVar18 = 0;
                  iVar35 = 0;
                  iVar21 = 0;
                  iVar19 = 0;
                  uVar29 = 0;
                }
                ppVar22->score = iVar20;
                ppVar22->end_query = uVar29;
                ppVar22->end_ref = iVar19;
                ((ppVar22->field_4).stats)->matches = iVar18;
                ((ppVar22->field_4).stats)->similar = iVar35;
                ((ppVar22->field_4).stats)->length = iVar21;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar22;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}